

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

int __thiscall
CVmObjDict::getp_is_defined(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  ushort uVar1;
  uint uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  uint hash;
  ushort *puVar5;
  vm_val_t *this_00;
  vm_val_t filter;
  isdef_ctx ctx;
  undefined8 local_c8;
  anon_union_8_8_cb74652f_for_val aStack_c0;
  int local_b8 [2];
  undefined8 local_b0;
  anon_union_8_8_cb74652f_for_val aStack_a8;
  ushort *local_a0;
  ulong local_98;
  undefined8 *local_90;
  undefined8 local_88;
  CVmObjDict *local_80;
  vm_rcdesc local_78;
  
  if (getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_is_defined();
  }
  if (argc == (uint *)0x0) {
    val->typ = VM_NATIVE_CODE;
    (val->val).ptr = &getp_is_defined::desc;
  }
  else {
    uVar2 = *argc;
    iVar4 = CVmObject::get_prop_check_argc(val,argc,&getp_is_defined::desc);
    pvVar3 = sp_;
    if (iVar4 == 0) {
      this_00 = sp_ + -1;
      puVar5 = (ushort *)vm_val_t::get_as_string(this_00);
      if (puVar5 == (ushort *)0x0) {
        err_throw(0x7e3);
      }
      uVar1 = *puVar5;
      if (uVar2 < 2) {
        local_c8 = CONCAT44(local_c8._4_4_,1);
      }
      else {
        local_c8 = *(undefined8 *)(sp_ + -2);
        aStack_c0 = sp_[-2].val;
      }
      hash = calc_str_hash(this,this_00,(char *)(puVar5 + 1),(ulong)uVar1);
      local_88 = 0;
      local_b8[0] = 0;
      local_b0 = *(undefined8 *)this_00;
      aStack_a8 = pvVar3[-1].val;
      local_90 = &local_c8;
      local_a0 = puVar5 + 1;
      local_98 = (ulong)uVar1;
      local_80 = this;
      vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"Dict.isDefined");
      CVmHashTable::enum_hash_matches
                (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),hash,isdef_cb,local_b8);
      val->typ = VM_TRUE - (local_b8[0] == 0);
      sp_ = sp_ + -(long)(int)uVar2;
    }
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_is_defined(VMG_ vm_obj_id_t self, vm_val_t *val,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(1, 1);
    uint orig_argc = (argc == 0 ? 0 : *argc);
    vm_val_t *arg0;
    const char *strp;
    size_t strl;
    vm_val_t filter;
    unsigned int hash;
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* 
     *   make sure the argument is a string, but leave it on the stack for
     *   gc protection 
     */
    arg0 = G_stk->get(0);
    if ((strp = arg0->get_as_string(vmg0_)) == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* read and skip the string's length prefix */
    strl = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a second argument, it's the filter function */
    if (orig_argc >= 2)
    {
        /* retrieve the filter */
        filter = *G_stk->get(1);
    }
    else
    {
        /* there's no filter */
        filter.set_nil();
    }

    /* calculate the hash code */
    hash = calc_str_hash(vmg_ arg0, strp, strl);

    /* enumerate matches for the string */
    isdef_ctx ctx(vmg_ this, &filter, arg0, strp, strl);
    ctx.rc.init(vmg_ "Dict.isDefined", self, 5, arg0, orig_argc);
    get_ext()->hashtab_->enum_hash_matches(hash, &isdef_cb, &ctx);

    /* if we found any matches, return true; otherwise, return nil */
    val->set_logical(ctx.found);

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* success */
    return TRUE;
}